

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlSchemaValidCtxtPtrWrap(xmlSchemaValidCtxtPtr valid)

{
  PyObject *ret;
  xmlSchemaValidCtxtPtr valid_local;
  
  if (valid == (xmlSchemaValidCtxtPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    valid_local = (xmlSchemaValidCtxtPtr)&_Py_NoneStruct;
  }
  else {
    valid_local = (xmlSchemaValidCtxtPtr)PyCapsule_New(valid,"xmlSchemaValidCtxtPtr",0);
  }
  return (PyObject *)valid_local;
}

Assistant:

PyObject *
libxml_xmlSchemaValidCtxtPtrWrap(xmlSchemaValidCtxtPtr valid)
{
	PyObject *ret;
	
	if (valid == NULL) {
		Py_INCREF(Py_None);
		return (Py_None);
	}

	ret = 
		PyCapsule_New((void *) valid,
									 (char *) "xmlSchemaValidCtxtPtr", NULL);

	return (ret);
}